

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebraReasoning.cpp
# Opt level: O1

Clause * __thiscall Inferences::DistinctnessISE::simplify(DistinctnessISE *this,Clause *c)

{
  Literal *lit;
  bool bVar1;
  Clause *unaff_R12;
  Clause *pCVar2;
  ulong uVar3;
  SimplifyingInference1 local_70;
  Inference local_60;
  
  pCVar2 = c;
  if (((c->super_Unit)._inference.field_0x2 & 2) == 0) {
    uVar3 = (ulong)((uint)*(undefined8 *)&c->field_0x38 & 0xfffff);
    do {
      if ((long)uVar3 < 1) {
        return c;
      }
      lit = c->_literals[uVar3 - 1];
      bVar1 = distinctConstructorsEquality(lit);
      if (bVar1) {
        if (((lit->super_Term)._args[0]._content & 4) == 0) {
          *(int *)(DAT_00b7e1c0 + 0x1c0) = *(int *)(DAT_00b7e1c0 + 0x1c0) + 1;
          unaff_R12 = (Clause *)0x0;
        }
        else {
          local_70.rule = TERM_ALGEBRA_DISTINCTNESS;
          local_70.premise = c;
          Kernel::Inference::Inference(&local_60,&local_70);
          unaff_R12 = removeLit(c,(int)uVar3 - 1,&local_60);
          *(int *)(DAT_00b7e1c0 + 0x1bc) = *(int *)(DAT_00b7e1c0 + 0x1bc) + 1;
        }
      }
      uVar3 = uVar3 - 1;
      pCVar2 = unaff_R12;
    } while (!bVar1);
  }
  return pCVar2;
}

Assistant:

Clause* DistinctnessISE::simplify(Clause* c)
  {
    if (c->isPureTheoryDescendant())
      return c;
    
    int length = c->length();
    for (int i = length - 1; i >= 0; i--) {
      Literal *lit = (*c)[i];
      if (distinctConstructorsEquality(lit)) {
        if (lit->isPositive()) {
          // equality of the form f(x) = g(y), delete literal from clause
          Clause* res = removeLit(c, i, SimplifyingInference1(InferenceRule::TERM_ALGEBRA_DISTINCTNESS, c));
          env.statistics->taDistinctnessSimplifications++;
          return res;
        } else {
          // inequality of the form f(x) != g(y) are theory tautologies
          env.statistics->taDistinctnessTautologyDeletions++;
          return 0;
        }
      }
    }

    // no equalities between distinct constructors were found
    return c;
  }